

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.h
# Opt level: O2

void __thiscall idx2::mmap_err_code_s::mmap_err_code_s(mmap_err_code_s *this,mmap_err_code Value)

{
  mmap_err_code *pmVar1;
  mmap_err_code mVar2;
  long lVar3;
  
  lVar3 = 0x10;
  do {
    mVar2 = __Invalid__;
    if (lVar3 == 0x298) break;
    pmVar1 = (mmap_err_code *)((long)&NameMap.Arr[0].Name.field_0 + lVar3);
    lVar3 = lVar3 + 0x18;
    mVar2 = Value;
  } while (*pmVar1 != Value);
  this->Val = mVar2;
  return;
}

Assistant:

idx2_Enum(mmap_err_code,
          int,
          idx2_CommonErrs,
          MappingFailed,
          MapViewFailed,
          AllocateFailed,
          FlushFailed,
          SyncFailed,
          UnmapFailed);


namespace idx2
{


enum class map_mode
{
  Read,
  Write
};

#if defined(_WIN32)
using file_handle = HANDLE;
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
using file_handle = int;
#endif

struct mmap_file
{
  file_handle File;
  file_handle FileMapping;
  map_mode Mode;
  buffer Buf;
};

error<mmap_err_code>
OpenFile(mmap_file* MMap, cstr Name, map_mode Mode);

error<mmap_err_code>
MapFile(mmap_file* MMap, i64 Bytes = 0);

error<mmap_err_code>
FlushFile(mmap_file* MMap, byte* Start = nullptr, i64 Bytes = 0);

error<mmap_err_code>
SyncFile(mmap_file* MMap);

error<mmap_err_code>
UnmapFile(mmap_file* MMap);

error<mmap_err_code>
CloseFile(mmap_file* MMap);

template <typename t> void
Write(mmap_file* MMap, const t* Data);

template <typename t> void
Write(mmap_file* MMap, const t* Data, i64 Size);

template <typename t> void
Write(mmap_file* MMap, t Val);


}